

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O3

int ConnectMT(MT *pMT,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  int nbdatabytes;
  uchar gotoconfigbuf [5];
  uchar gotomeasurementbuf [5];
  uchar reqconfigurationbuf [5];
  char line [256];
  uchar databuf [2048];
  int local_9b4;
  undefined4 local_9b0;
  undefined1 local_9ac;
  uint8 local_9a8 [8];
  uint8 local_9a0 [8];
  int *local_998;
  BOOL *local_990;
  BOOL *local_988;
  double *local_980;
  double *local_978;
  double *local_970;
  double *local_968;
  double *local_960;
  double *local_958;
  double *local_950;
  double *local_948;
  double *local_940;
  byte local_938;
  char local_937;
  uchar local_838 [104];
  ushort local_7d0;
  uint local_7ce;
  
  local_9ac = 0;
  local_9b0 = 0x30fffa;
  local_9a0[4] = 0;
  local_9a0[0] = 0xfa;
  local_9a0[1] = 0xff;
  local_9a0[2] = '\f';
  local_9a0[3] = '\0';
  local_9a8[4] = 0;
  local_9a8[0] = 0xfa;
  local_9a8[1] = 0xff;
  local_9a8[2] = '\x10';
  local_9a8[3] = '\0';
  local_9b4 = 0;
  memset(pMT->szCfgFilePath,0,0x100);
  sprintf(pMT->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_938,0,0x100);
    memset(pMT->szDevPath + 5,0,0xfb);
    builtin_strncpy(pMT->szDevPath,"COM1",5);
    pMT->BaudRate = 0x1c200;
    pMT->timeout = 1000;
    pMT->threadperiod = 0x32;
    pMT->bSaveRawData = 1;
    pMT->bLegacyMode = 1;
    pMT->rollorientation = 0.0;
    pMT->rollp1 = 0.0;
    pMT->rollp2 = 0.0;
    pMT->pitchorientation = 0.0;
    pMT->pitchp1 = 0.0;
    pMT->pitchp2 = 0.0;
    pMT->yaworientation = 0.0;
    pMT->yawp1 = 0.0;
    pMT->yawp2 = 0.0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_998 = &pMT->threadperiod;
      local_990 = &pMT->bSaveRawData;
      local_988 = &pMT->bLegacyMode;
      local_980 = &pMT->rollorientation;
      local_978 = &pMT->rollp1;
      local_970 = &pMT->rollp2;
      local_968 = &pMT->pitchorientation;
      local_960 = &pMT->pitchp1;
      local_958 = &pMT->pitchp2;
      local_950 = &pMT->yaworientation;
      local_948 = &pMT->yawp1;
      local_940 = &pMT->yawp2;
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00110e3e;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00110e56;
        }
        if (local_938 != 0x23) break;
LAB_00110e3e:
        if (pcVar2 == (char *)0x0) goto LAB_00110e5b;
      }
      if (local_938 == 0x24) goto LAB_00110e5b;
LAB_00110e56:
      if (pcVar2 == (char *)0x0) {
LAB_00110e5b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%255s",pMT->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00110ed6;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00110ee2;
        }
        if (local_938 != 0x23) break;
LAB_00110ed6:
        if (pcVar2 == (char *)0x0) goto LAB_00110ee7;
      }
      if (local_938 == 0x24) goto LAB_00110ee7;
LAB_00110ee2:
      if (pcVar2 == (char *)0x0) {
LAB_00110ee7:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%d",&pMT->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00110f62;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00110f6e;
        }
        if (local_938 != 0x23) break;
LAB_00110f62:
        if (pcVar2 == (char *)0x0) goto LAB_00110f73;
      }
      if (local_938 == 0x24) goto LAB_00110f73;
LAB_00110f6e:
      if (pcVar2 == (char *)0x0) {
LAB_00110f73:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%d",&pMT->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00110fee;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00110ffa;
        }
        if (local_938 != 0x23) break;
LAB_00110fee:
        if (pcVar2 == (char *)0x0) goto LAB_00110fff;
      }
      if (local_938 == 0x24) goto LAB_00110fff;
LAB_00110ffa:
      if (pcVar2 == (char *)0x0) {
LAB_00110fff:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%d",local_998);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_0011107c;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00111088;
        }
        if (local_938 != 0x23) break;
LAB_0011107c:
        if (pcVar2 == (char *)0x0) goto LAB_0011108d;
      }
      if (local_938 == 0x24) goto LAB_0011108d;
LAB_00111088:
      if (pcVar2 == (char *)0x0) {
LAB_0011108d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%d",local_990);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_0011110a;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00111116;
        }
        if (local_938 != 0x23) break;
LAB_0011110a:
        if (pcVar2 == (char *)0x0) goto LAB_0011111b;
      }
      if (local_938 == 0x24) goto LAB_0011111b;
LAB_00111116:
      if (pcVar2 == (char *)0x0) {
LAB_0011111b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%d",local_988);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00111198;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_001111a4;
        }
        if (local_938 != 0x23) break;
LAB_00111198:
        if (pcVar2 == (char *)0x0) goto LAB_001111a9;
      }
      if (local_938 == 0x24) goto LAB_001111a9;
LAB_001111a4:
      if (pcVar2 == (char *)0x0) {
LAB_001111a9:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_980);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00111226;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00111232;
        }
        if (local_938 != 0x23) break;
LAB_00111226:
        if (pcVar2 == (char *)0x0) goto LAB_00111237;
      }
      if (local_938 == 0x24) goto LAB_00111237;
LAB_00111232:
      if (pcVar2 == (char *)0x0) {
LAB_00111237:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_978);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_001112b4;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_001112c0;
        }
        if (local_938 != 0x23) break;
LAB_001112b4:
        if (pcVar2 == (char *)0x0) goto LAB_001112c5;
      }
      if (local_938 == 0x24) goto LAB_001112c5;
LAB_001112c0:
      if (pcVar2 == (char *)0x0) {
LAB_001112c5:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_970);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_00111342;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_0011134e;
        }
        if (local_938 != 0x23) break;
LAB_00111342:
        if (pcVar2 == (char *)0x0) goto LAB_00111353;
      }
      if (local_938 == 0x24) goto LAB_00111353;
LAB_0011134e:
      if (pcVar2 == (char *)0x0) {
LAB_00111353:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_968);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_001113d0;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_001113dc;
        }
        if (local_938 != 0x23) break;
LAB_001113d0:
        if (pcVar2 == (char *)0x0) goto LAB_001113e1;
      }
      if (local_938 == 0x24) goto LAB_001113e1;
LAB_001113dc:
      if (pcVar2 == (char *)0x0) {
LAB_001113e1:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_960);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_0011145e;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_0011146a;
        }
        if (local_938 != 0x23) break;
LAB_0011145e:
        if (pcVar2 == (char *)0x0) goto LAB_0011146f;
      }
      if (local_938 == 0x24) goto LAB_0011146f;
LAB_0011146a:
      if (pcVar2 == (char *)0x0) {
LAB_0011146f:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_958);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_001114ec;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_001114f8;
        }
        if (local_938 != 0x23) break;
LAB_001114ec:
        if (pcVar2 == (char *)0x0) goto LAB_001114fd;
      }
      if (local_938 == 0x24) goto LAB_001114fd;
LAB_001114f8:
      if (pcVar2 == (char *)0x0) {
LAB_001114fd:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_950);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_0011157a;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00111586;
        }
        if (local_938 != 0x23) break;
LAB_0011157a:
        if (pcVar2 == (char *)0x0) goto LAB_0011158b;
      }
      if (local_938 == 0x24) goto LAB_0011158b;
LAB_00111586:
      if (pcVar2 == (char *)0x0) {
LAB_0011158b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_948);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_938,0x100,__stream), 0x24 < local_938) {
          if (local_938 == 0x25) goto LAB_0011160b;
          if (((local_938 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_937 != '/'))
          goto LAB_00111617;
        }
        if (local_938 != 0x23) break;
LAB_0011160b:
        if (pcVar2 == (char *)0x0) goto LAB_0011161c;
      }
      if (local_938 == 0x24) goto LAB_0011161c;
LAB_00111617:
      if (pcVar2 == (char *)0x0) {
LAB_0011161c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_938,"%lf",local_940);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0011166f;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0011166f:
  if (pMT->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pMT->threadperiod = 0x32;
  }
  memset(&pMT->LastMTData,0,0x130);
  iVar1 = OpenRS232Port(&pMT->RS232Port,pMT->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a MT.");
    return 1;
  }
  iVar1 = (pMT->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pMT->RS232Port).hDev,pMT->BaudRate,'\0',0,'\b','\x02',pMT->timeout),
       iVar1 != 0)) {
      pcVar2 = "Unable to connect to a MT.";
      goto LAB_001118bf;
    }
    tcflush(*(int *)&(pMT->RS232Port).hDev,2);
    iVar1 = (pMT->RS232Port).DevType;
  }
  local_9ac = 0xd1;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMT->RS232Port).s;
    uVar5 = 0;
    do {
      sVar3 = send(iVar1,(void *)((long)&local_9b0 + uVar5),(ulong)(5 - (int)uVar5),0);
      if ((int)sVar3 < 1) goto LAB_001118b8;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < 5);
LAB_0011178c:
    memset(local_838,0,0x800);
    local_9b4 = 0;
    iVar1 = GetLatestMTMessageMT(pMT,0xff,0x31,local_838,0x800,&local_9b4);
    if (iVar1 == 0) {
      local_9a0[4] = 0xf5;
      iVar1 = WriteAllRS232Port(&pMT->RS232Port,local_9a0,5);
      if (iVar1 == 0) {
        memset(local_838,0,0x800);
        local_9b4 = 0;
        iVar1 = GetLatestMTMessageMT(pMT,0xff,0xd,local_838,0x800,&local_9b4);
        if (iVar1 == 0) {
          pMT->OutputMode = (uint)(ushort)(local_7d0 << 8 | local_7d0 >> 8);
          pMT->OutputSettings =
               local_7ce >> 0x18 | (local_7ce & 0xff0000) >> 8 | (local_7ce & 0xff00) << 8 |
               local_7ce << 0x18;
          local_9a8[4] = 0xf1;
          iVar1 = WriteAllRS232Port(&pMT->RS232Port,local_9a8,5);
          if (iVar1 == 0) {
            memset(local_838,0,0x800);
            local_9b4 = 0;
            iVar1 = GetLatestMTMessageMT(pMT,0xff,0x11,local_838,0x800,&local_9b4);
            if (iVar1 == 0) {
              puts("MT connected.");
              return 0;
            }
          }
        }
      }
    }
  }
  else if (iVar1 == 0) {
    iVar1 = *(int *)&(pMT->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar3 = write(iVar1,(void *)((long)&local_9b0 + uVar5),(ulong)(5 - (int)uVar5));
      if ((int)sVar3 < 1) goto LAB_001118b8;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < 5);
    goto LAB_0011178c;
  }
LAB_001118b8:
  pcVar2 = "Unable to connect to a MT : Initialization failure.";
LAB_001118bf:
  puts(pcVar2);
  CloseRS232Port(&pMT->RS232Port);
  return 1;
}

Assistant:

inline int ConnectMT(MT* pMT, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	unsigned char gotoconfigbuf[] = {PREAMBLE_MT,ADDR_MT,GO_TO_CONFIG_MID,0x00,0x00};
	unsigned char reqconfigurationbuf[] = {PREAMBLE_MT,ADDR_MT,REQ_CONFIGURATION_MID,0x00,0x00};
	unsigned char gotomeasurementbuf[] = {PREAMBLE_MT,ADDR_MT,GO_TO_MEASUREMENT_MID,0x00,0x00};
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	uShort_MT OutputMode;
	uInt_MT OutputSettings;

	memset(pMT->szCfgFilePath, 0, sizeof(pMT->szCfgFilePath));
	sprintf(pMT->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMT->szDevPath, 0, sizeof(pMT->szDevPath));
		sprintf(pMT->szDevPath, "COM1");
		pMT->BaudRate = 115200;
		pMT->timeout = 1000;
		pMT->threadperiod = 50;
		pMT->bSaveRawData = 1;
		pMT->bLegacyMode = 1;
		pMT->rollorientation = 0;
		pMT->rollp1 = 0;
		pMT->rollp2 = 0;
		pMT->pitchorientation = 0;
		pMT->pitchp1 = 0;
		pMT->pitchp2 = 0;
		pMT->yaworientation = 0;
		pMT->yawp1 = 0;
		pMT->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMT->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->bLegacyMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMT->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMT->threadperiod = 50;
	}

	// Used to save raw data, should be handled specifically...
	//pMT->pfSaveFile = NULL;

	memset(&pMT->LastMTData, 0, sizeof(MTDATA));

	if (OpenRS232Port(&pMT->RS232Port, pMT->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMT->RS232Port, pMT->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pMT->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	// Go to configuration state.
	SetMTChecksum(gotoconfigbuf, sizeof(gotoconfigbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, gotoconfigbuf, sizeof(gotoconfigbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, GO_TO_CONFIG_ACK_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	// Request the current configuration.
	SetMTChecksum(reqconfigurationbuf, sizeof(reqconfigurationbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, reqconfigurationbuf, sizeof(reqconfigurationbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, CONFIGURATION_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	// Analyze the configuration returned.
	OutputMode.c[0] = databuf[105];
	OutputMode.c[1] = databuf[104];
	OutputSettings.c[0] = databuf[109];
	OutputSettings.c[1] = databuf[108];
	OutputSettings.c[2] = databuf[107];
	OutputSettings.c[3] = databuf[106];

	pMT->OutputMode = OutputMode.v;
	pMT->OutputSettings = OutputSettings.v;

	// Go to measurement state.
	SetMTChecksum(gotomeasurementbuf, sizeof(gotomeasurementbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, gotomeasurementbuf, sizeof(gotomeasurementbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, GO_TO_MEASUREMENT_ACK_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	printf("MT connected.\n");

	return EXIT_SUCCESS;
}